

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_77::AsyncPipe::write(AsyncPipe *this,int __fd,void *__buf,size_t __n)

{
  size_t sVar1;
  AsyncIoStream *pAVar2;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces;
  _func_int **pp_Var3;
  undefined4 in_register_00000034;
  bool bVar4;
  ArrayPtr<const_unsigned_char> *local_30;
  _func_int **pp_Stack_28;
  
  bVar4 = __n == 0;
  if (!bVar4) {
    sVar1 = *(size_t *)((long)__buf + 8);
    while (sVar1 == 0) {
      bVar4 = __n == 1;
      if (bVar4) goto LAB_0031b2d3;
      __n = __n - 1;
      sVar1 = ((ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10))->size_;
      __buf = (ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10);
    }
    if (!bVar4) {
      pAVar2 = (((AsyncPipe *)CONCAT44(in_register_00000034,__fd))->state).ptr;
      if (pAVar2 != (AsyncIoStream *)0x0) {
        (*(pAVar2->super_AsyncOutputStream)._vptr_AsyncOutputStream[1])
                  (this,&pAVar2->super_AsyncOutputStream,__buf);
        return (ssize_t)this;
      }
      local_30 = (ArrayPtr<const_unsigned_char> *)((long)__buf + 0x10);
      pp_Stack_28 = (_func_int **)(__n - 1);
      pp_Var3 = (_func_int **)operator_new(0x1d0);
      pp_Var3[1] = (_func_int *)0x0;
      *pp_Var3 = (_func_int *)&PTR_onReady_00467b10;
      pp_Var3[2] = (_func_int *)&PTR_fulfill_00467b58;
      *(undefined1 *)(pp_Var3 + 3) = 0;
      *(undefined1 *)(pp_Var3 + 0x2f) = 0;
      *(undefined1 *)(pp_Var3 + 0x30) = 1;
      morePieces.size_ = (size_t)pp_Stack_28;
      morePieces.ptr = local_30;
      BlockedWrite::BlockedWrite
                ((BlockedWrite *)(pp_Var3 + 0x31),(PromiseFulfiller<void> *)(pp_Var3 + 2),
                 (AsyncPipe *)CONCAT44(in_register_00000034,__fd),*__buf,morePieces);
      (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
           (_func_int **)
           &_::
            HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>>
            ::instance;
      (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Var3;
      return (ssize_t)this;
    }
  }
LAB_0031b2d3:
  heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_30);
  (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = (_func_int **)local_30
  ;
  (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Stack_28;
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    while (pieces.size() > 0 && pieces[0].size() == 0) {
      pieces = pieces.slice(1, pieces.size());
    }

    if (pieces.size() == 0) {
      return kj::READY_NOW;
    } else KJ_IF_MAYBE(s, state) {
      return s->write(pieces);
    } else {
      return newAdaptedPromise<void, BlockedWrite>(
          *this, pieces[0], pieces.slice(1, pieces.size()));
    }
  }